

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

string * __thiscall
tcu::Format::Hex<4ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  size_t sVar1;
  char shortFmt [9];
  char buf [19];
  char local_38 [16];
  char local_28 [24];
  
  builtin_strncpy(local_38,"0x%04llx",9);
  deSprintf(local_28,0x13,local_38,*this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_28,local_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		DE_STATIC_ASSERT(0 < NumDigits && NumDigits <= 16);

		const char longFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits/10, '0' + NumDigits%10, 'l', 'l', 'x', 0};
		const char shortFmt[]	= {'0', 'x', '%', '0', '0' + NumDigits, 'l', 'l', 'x', 0};

		char buf[sizeof(deUint64)*2 + 3];
		deSprintf(buf, sizeof(buf), NumDigits > 9 ? longFmt : shortFmt, value);

		return std::string(buf);
	}